

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.h
# Opt level: O1

VSubst<8UL> * __thiscall GF2::VSubst<8UL>::Rand(VSubst<8UL> *this)

{
  WW<8UL> *pWVar1;
  u32 uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  word wVar8;
  word wVar9;
  
  wVar8 = 0;
  wVar9 = 1;
  lVar3 = 0;
  do {
    pWVar1 = (this->super_VFunc<8UL,_8UL>).super_Func<8UL,_GF2::WW<8UL>_>._vals + lVar3;
    pWVar1->_words[0] = wVar8;
    pWVar1[1]._words[0] = wVar9;
    lVar3 = lVar3 + 2;
    wVar8 = wVar8 + 2;
    wVar9 = wVar9 + 2;
  } while (lVar3 != 0x100);
  uVar6 = 0xff;
  do {
    uVar2 = Env::Rand();
    uVar5 = (ulong)uVar2 % (uVar6 + 1);
    if (uVar6 != uVar5) {
      uVar4 = (this->super_VFunc<8UL,_8UL>).super_Func<8UL,_GF2::WW<8UL>_>._vals[uVar6]._words[0] ^
              (this->super_VFunc<8UL,_8UL>).super_Func<8UL,_GF2::WW<8UL>_>._vals[uVar5]._words[0];
      (this->super_VFunc<8UL,_8UL>).super_Func<8UL,_GF2::WW<8UL>_>._vals[uVar6]._words[0] = uVar4;
      uVar4 = uVar4 ^ (this->super_VFunc<8UL,_8UL>).super_Func<8UL,_GF2::WW<8UL>_>._vals[uVar5].
                      _words[0];
      (this->super_VFunc<8UL,_8UL>).super_Func<8UL,_GF2::WW<8UL>_>._vals[uVar5]._words[0] = uVar4;
      pWVar1 = (this->super_VFunc<8UL,_8UL>).super_Func<8UL,_GF2::WW<8UL>_>._vals + uVar6;
      pWVar1->_words[0] = pWVar1->_words[0] ^ uVar4;
    }
    bVar7 = uVar6 != 0;
    uVar6 = uVar6 - 1;
  } while (bVar7);
  return this;
}

Assistant:

VSubst& Rand()
	{
		First();
		for (word x = _size; x != 0; x--)
			Transpose(x - 1, Env::Rand() % x);
		return *this;
	}